

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O2

void __thiscall pstore::file::system_error::~system_error(system_error *this)

{
  *(undefined ***)this = &PTR__system_error_001cf860;
  std::__cxx11::string::~string((string *)&this->path_);
  std::system_error::~system_error(&this->super_system_error);
  return;
}

Assistant:

system_error::~system_error () noexcept = default;